

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O3

void InterpreterThunkEmitter::EncodeInterpreterThunk
               (BYTE *thunkBuffer,intptr_t thunkBufferStartAddress,intptr_t epilogStart,
               DWORD epilogSize,intptr_t interpreterThunk)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (*(long *)(thunkBuffer + 0x3d) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.h"
                       ,0x76,"(*(T*) (dest + offset) == 0)",
                       "Overwriting an already existing opcode?");
    if (!bVar2) goto LAB_0056545d;
    *puVar3 = 0;
  }
  *(intptr_t *)(thunkBuffer + 0x3d) = interpreterThunk;
  thunkBuffer[0xf] = 'p';
  thunkBuffer[7] = '(';
  thunkBuffer[0xb] = '\b';
  if (*(long *)(thunkBuffer + 0x19) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.h"
                       ,0x76,"(*(T*) (dest + offset) == 0)",
                       "Overwriting an already existing opcode?");
    if (!bVar2) goto LAB_0056545d;
    *puVar3 = 0;
  }
  *(intptr_t *)(thunkBuffer + 0x19) = thunkBufferStartAddress + 0x48;
  if (*(int *)(thunkBuffer + 0x27) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.h"
                       ,0x76,"(*(T*) (dest + offset) == 0)",
                       "Overwriting an already existing opcode?");
    if (!bVar2) goto LAB_0056545d;
    *puVar3 = 0;
  }
  *(int *)(thunkBuffer + 0x27) = (int)epilogStart - (int)(thunkBufferStartAddress + 0x48);
  if (thunkBuffer[0x30] != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.h"
                       ,0x76,"(*(T*) (dest + offset) == 0)",
                       "Overwriting an already existing opcode?");
    if (!bVar2) {
LAB_0056545d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  thunkBuffer[0x30] = '\x05';
  return;
}

Assistant:

void InterpreterThunkEmitter::EncodeInterpreterThunk(
    __in_bcount(InterpreterThunkSize) BYTE* thunkBuffer,
    __in const intptr_t thunkBufferStartAddress,
    __in const intptr_t epilogStart,
    __in const DWORD epilogSize,
    __in const intptr_t interpreterThunk)
{
    Emit(thunkBuffer, ThunkAddressOffset, (uintptr_t)interpreterThunk);
    thunkBuffer[DynamicThunkAddressOffset] = Js::FunctionBody::GetOffsetOfDynamicInterpreterThunk();
    thunkBuffer[FunctionInfoOffset] = Js::JavascriptFunction::GetOffsetOfFunctionInfo();
    thunkBuffer[FunctionProxyOffset] = Js::FunctionInfo::GetOffsetOfFunctionProxy();
    Emit(thunkBuffer, CallBlockStartAddrOffset, (uintptr_t) thunkBufferStartAddress + HeaderSize);
    uint totalThunkSize = (uint)(epilogStart - (thunkBufferStartAddress + HeaderSize));
    Emit(thunkBuffer, ThunkSizeOffset, totalThunkSize);
    Emit(thunkBuffer, ErrorOffset, (BYTE) FAST_FAIL_INVALID_ARG);
}